

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::detail::Dispatch_Engine::call_member
          (Dispatch_Engine *this,string *t_name,atomic_uint_fast32_t *t_loc,Function_Params *params,
          bool t_has_params,Type_Conversions_State *t_conversions)

{
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  *l_funs;
  bool bVar1;
  bool bVar2;
  element_type *peVar3;
  Type_Conversions_State *l_conversions;
  Boxed_Value *pBVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Boxed_Value *__last;
  dispatch_error *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000081;
  Function_Params *t_params;
  Boxed_Value BVar5;
  Function_Params l_params;
  Function_Params l_params_00;
  undefined1 auVar6 [12];
  Type_Conversions_State *in_stack_00000008;
  allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> local_241;
  __normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  local_240;
  __normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  local_238;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_230;
  exception_ptr local_218 [13];
  option_explicit_set *e;
  undefined1 local_19a;
  allocator<chaiscript::Boxed_Value> local_199;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_180;
  undefined1 local_178 [8];
  array<chaiscript::Boxed_Value,_3UL> p;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  *local_140;
  value_type local_130;
  __normal_iterator<chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  local_120;
  __normal_iterator<chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  local_118;
  const_iterator local_110;
  undefined1 local_108 [8];
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> tmp_params;
  undefined1 auStack_e0 [7];
  bool is_no_param;
  Function_Params *local_d8;
  undefined1 local_c8 [8];
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  functions;
  dispatch_error *anon_var_0;
  exception_ptr except;
  string *local_70;
  anon_class_8_1_8991fb9c do_attribute_call;
  undefined1 local_58 [8];
  pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  funs;
  uint_fast32_t loc;
  bool t_has_params_local;
  Function_Params *params_local;
  atomic_uint_fast32_t *t_loc_local;
  string *t_name_local;
  Dispatch_Engine *this_local;
  
  t_params = (Function_Params *)CONCAT71(in_register_00000081,t_has_params);
  funs.second.
  super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)params);
  _do_attribute_call = std::__cxx11::string::operator_cast_to_basic_string_view((string *)t_loc);
  get_function((pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
                *)local_58,(Dispatch_Engine *)t_name,_do_attribute_call,
               (size_t)funs.second.
                       super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
  if (local_58 !=
      (undefined1  [8])
      funs.second.
      super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi) {
    std::__atomic_base<unsigned_long>::operator=
              ((__atomic_base<unsigned_long> *)params,(__int_type)local_58);
  }
  local_70 = t_name;
  peVar3 = std::
           __shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&funs);
  bVar1 = is_attribute_call(peVar3,t_params,(bool)((byte)t_conversions & 1),in_stack_00000008);
  if (bVar1) {
    pBVar4 = t_params->m_begin;
    l_funs = (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
              *)t_params->m_end;
    l_conversions =
         (Type_Conversions_State *)
         std::
         __shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator*((__shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&funs);
    l_params.m_end = pBVar4;
    l_params.m_begin = (Boxed_Value *)0x1;
    call_member::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)this,(int)&local_70,l_params,l_funs,l_conversions);
    except._M_exception_object._0_4_ = 1;
  }
  else {
    std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)&anon_var_0);
    peVar3 = std::
             __shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&funs);
    bVar1 = std::
            vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
            ::empty(peVar3);
    if (bVar1) {
      _auStack_e0 = (Dispatch_Engine *)t_name;
      local_d8 = t_params;
      call_member::anon_class_24_3_e36f5151::operator()
                ((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                  *)local_c8,(anon_class_24_3_e36f5151 *)auStack_e0);
      tmp_params.
      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_c8;
      bVar1 = call_member::anon_class_8_1_0d378e3b::operator()
                        ((anon_class_8_1_0d378e3b *)
                         &tmp_params.
                          super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = std::
              vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
              ::empty((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                       *)local_c8);
      if (bVar2) {
        bVar1 = std::__exception_ptr::exception_ptr::operator_cast_to_bool
                          ((exception_ptr *)&anon_var_0);
        if (!bVar1) {
          this_01 = (dispatch_error *)__cxa_allocate_exception(0x40);
          peVar3 = std::
                   __shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&funs);
          local_238._M_current =
               (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)
               std::
               vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
               ::begin(peVar3);
          peVar3 = std::
                   __shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&funs);
          local_240._M_current =
               (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)
               std::
               vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
               ::end(peVar3);
          std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>::
          allocator(&local_241);
          std::
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
          ::
          vector<__gnu_cxx::__normal_iterator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>*,std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>,void>
                    ((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>
                      *)&local_230,local_238,local_240,&local_241);
          chaiscript::exception::dispatch_error::dispatch_error(this_01,t_params,&local_230);
          __cxa_throw(this_01,&chaiscript::exception::dispatch_error::typeinfo,
                      chaiscript::exception::dispatch_error::~dispatch_error);
        }
        std::__exception_ptr::exception_ptr::exception_ptr(local_218,(exception_ptr *)&anon_var_0);
        auVar6 = std::rethrow_exception((exception_ptr)local_218);
        except._M_exception_object._4_4_ = auVar6._8_4_;
        std::__exception_ptr::exception_ptr::~exception_ptr(local_218);
        std::
        vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
        ::~vector((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                   *)local_c8);
        std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)&anon_var_0);
        std::
        pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
        ::~pair((pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
                 *)local_58);
        _Unwind_Resume(auVar6._0_8_);
      }
      if (bVar1) {
        Function_Params::to_vector
                  ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                   local_108,t_params);
        local_120._M_current =
             (Boxed_Value *)
             std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::begin
                       ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *
                        )local_108);
        local_118 = __gnu_cxx::
                    __normal_iterator<chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                    ::operator+(&local_120,1);
        __gnu_cxx::
        __normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
        ::__normal_iterator<chaiscript::Boxed_Value*>
                  ((__normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
                    *)&local_110,&local_118);
        var<std::__cxx11::string_const&>
                  ((chaiscript *)&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t_loc);
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::insert
                  ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                   local_108,local_110,&local_130);
        Boxed_Value::~Boxed_Value(&local_130);
        Function_Params::Function_Params
                  ((Function_Params *)
                   &p._M_elems[2].m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                   local_108);
        l_params_00.m_end =
             (Boxed_Value *)
             p._M_elems[2].m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        l_params_00.m_begin = (Boxed_Value *)0x2;
        call_member::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)this,(int)&local_70,l_params_00,local_140,
                   (Type_Conversions_State *)local_c8);
        except._M_exception_object._0_4_ = 1;
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
                  ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                   local_108);
      }
      else {
        local_19a = 1;
        local_180 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_178;
        pBVar4 = Function_Params::operator[](t_params,0);
        Boxed_Value::Boxed_Value((Boxed_Value *)local_178,pBVar4);
        local_180 = &p._M_elems[0].m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
        var<std::__cxx11::string_const&>
                  ((chaiscript *)local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t_loc);
        this_00 = &p._M_elems[1].m_data.
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        local_180 = this_00;
        pBVar4 = Function_Params::begin(t_params);
        __last = Function_Params::end(t_params);
        std::allocator<chaiscript::Boxed_Value>::allocator(&local_199);
        std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
        vector<chaiscript::Boxed_Value_const*,void>
                  ((vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>> *)
                   &local_198,pBVar4 + 1,__last,&local_199);
        var<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
                  ((chaiscript *)this_00,&local_198);
        local_19a = 0;
        std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
                  (&local_198);
        std::allocator<chaiscript::Boxed_Value>::~allocator(&local_199);
        Function_Params::Function_Params<3ul>
                  ((Function_Params *)&e,(array<chaiscript::Boxed_Value,_3UL> *)local_178);
        dispatch::
        dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
                  ((dispatch *)this,
                   (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                    *)local_c8,(Function_Params *)&e,in_stack_00000008);
        except._M_exception_object._0_4_ = 1;
        std::array<chaiscript::Boxed_Value,_3UL>::~array
                  ((array<chaiscript::Boxed_Value,_3UL> *)local_178);
      }
      std::
      vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
      ::~vector((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                 *)local_c8);
    }
    else {
      peVar3 = std::
               __shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&funs);
      dispatch::
      dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
                ((dispatch *)this,peVar3,t_params,in_stack_00000008);
      except._M_exception_object._0_4_ = 1;
    }
    std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)&anon_var_0);
  }
  std::
  pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  ::~pair((pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
           *)local_58);
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value call_member(const std::string &t_name,
                              std::atomic_uint_fast32_t &t_loc,
                              const Function_Params &params,
                              bool t_has_params,
                              const Type_Conversions_State &t_conversions) {
        uint_fast32_t loc = t_loc;
        const auto funs = get_function(t_name, loc);
        if (funs.first != loc) {
          t_loc = uint_fast32_t(funs.first);
        }

        const auto do_attribute_call = [this](int l_num_params,
                                              Function_Params l_params,
                                              const std::vector<Proxy_Function> &l_funs,
                                              const Type_Conversions_State &l_conversions) -> Boxed_Value {
          Function_Params attr_params(l_params.begin(), l_params.begin() + l_num_params);
          Boxed_Value bv = dispatch::dispatch(l_funs, attr_params, l_conversions);
          if (l_num_params < int(l_params.size()) || bv.get_type_info().bare_equal(user_type<dispatch::Proxy_Function_Base>())) {
            struct This_Foist {
              This_Foist(Dispatch_Engine &e, const Boxed_Value &t_bv)
                  : m_e(e) {
                m_e.get().new_scope();
                m_e.get().add_object("__this", t_bv);
              }

              ~This_Foist() { m_e.get().pop_scope(); }

              std::reference_wrapper<Dispatch_Engine> m_e;
            };

            This_Foist fi(*this, l_params.front());

            try {
              auto func = boxed_cast<const dispatch::Proxy_Function_Base *>(bv);
              try {
                return (*func)({l_params.begin() + l_num_params, l_params.end()}, l_conversions);
              } catch (const chaiscript::exception::bad_boxed_cast &) {
              } catch (const chaiscript::exception::arity_error &) {
              } catch (const chaiscript::exception::guard_error &) {
              }
              throw chaiscript::exception::dispatch_error({l_params.begin() + l_num_params, l_params.end()},
                                                          std::vector<Const_Proxy_Function>{boxed_cast<Const_Proxy_Function>(bv)});
            } catch (const chaiscript::exception::bad_boxed_cast &) {
              // unable to convert bv into a Proxy_Function_Base
              throw chaiscript::exception::dispatch_error({l_params.begin() + l_num_params, l_params.end()},
                                                          std::vector<Const_Proxy_Function>(l_funs.begin(), l_funs.end()));
            }
          } else {
            return bv;
          }
        };

        if (is_attribute_call(*funs.second, params, t_has_params, t_conversions)) {
          return do_attribute_call(1, params, *funs.second, t_conversions);
        } else {
          std::exception_ptr except;

          if (!funs.second->empty()) {
            try {
              return dispatch::dispatch(*funs.second, params, t_conversions);
            } catch (chaiscript::exception::dispatch_error &) {
              except = std::current_exception();
            }
          }

          // If we get here we know that either there was no method with that name,
          // or there was no matching method

          const auto functions = [&]() -> std::vector<Proxy_Function> {
            std::vector<Proxy_Function> fs;

            const auto method_missing_funs = get_method_missing_functions();

            for (const auto &f : *method_missing_funs) {
              if (f->compare_first_type(params[0], t_conversions)) {
                fs.push_back(f);
              }
            }

            return fs;
          }();

          const bool is_no_param = [&]() -> bool {
            for (const auto &f : functions) {
              if (f->get_arity() != 2) {
                return false;
              }
            }
            return true;
          }();

          if (!functions.empty()) {
            try {
              if (is_no_param) {
                auto tmp_params = params.to_vector();
                tmp_params.insert(tmp_params.begin() + 1, var(t_name));
                return do_attribute_call(2, Function_Params(tmp_params), functions, t_conversions);
              } else {
                std::array<Boxed_Value, 3> p{params[0], var(t_name), var(std::vector<Boxed_Value>(params.begin() + 1, params.end()))};
                return dispatch::dispatch(functions, Function_Params{p}, t_conversions);
              }
            } catch (const dispatch::option_explicit_set &e) {
              throw chaiscript::exception::dispatch_error(params,
                                                          std::vector<Const_Proxy_Function>(funs.second->begin(), funs.second->end()),
                                                          e.what());
            }
          }

          // If we get all the way down here we know there was no "method_missing"
          // method at all.
          if (except) {
            std::rethrow_exception(except);
          } else {
            throw chaiscript::exception::dispatch_error(params,
                                                        std::vector<Const_Proxy_Function>(funs.second->begin(), funs.second->end()));
          }
        }
      }